

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTexture2CommitmentTestCase::init
          (SparseTexture2CommitmentTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  value_type_conflict1 local_18 [2];
  SparseTexture2CommitmentTestCase *local_10;
  SparseTexture2CommitmentTestCase *this_local;
  
  local_10 = this;
  SparseTextureCommitmentTestCase::init(&this->super_SparseTextureCommitmentTestCase,ctx);
  std::vector<int,_std::allocator<int>_>::clear
            (&(this->super_SparseTextureCommitmentTestCase).mSupportedTargets);
  local_18[1] = 0x9100;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTextureCommitmentTestCase).mSupportedTargets,local_18 + 1);
  local_18[0] = 0x9102;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTextureCommitmentTestCase).mSupportedTargets,local_18);
  return extraout_EAX;
}

Assistant:

void SparseTexture2CommitmentTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	//Verify all targets once again and multisample targets as it was added in ARB_sparse_texture2 extension
	mSupportedTargets.clear();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}